

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_array_clear(json_t *json)

{
  json_t *json_00;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  iVar1 = -1;
  if ((json != (json_t *)0x0) && (iVar1 = -1, json->type == JSON_ARRAY)) {
    if (json[1].refcount != 0) {
      uVar3 = 0;
      do {
        json_00 = *(json_t **)(*(long *)(json + 2) + uVar3 * 8);
        if (((json_00 != (json_t *)0x0) && (json_00->refcount != 0xffffffffffffffff)) &&
           (sVar2 = json_00->refcount - 1, json_00->refcount = sVar2, sVar2 == 0)) {
          json_delete(json_00);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < json[1].refcount);
    }
    json[1].refcount = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_array_clear(json_t *json)
{
	json_array_t *array;
	size_t i;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	for (i = 0; i < array->entries; i++)
		json_decref(array->table[i]);

	array->entries = 0;
	return 0;
}